

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O0

CURLcode curlx_dyn_tail(dynbuf *s,size_t trail)

{
  size_t trail_local;
  dynbuf *s_local;
  
  if (s->leng < trail) {
    s_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else if (trail == s->leng) {
    s_local._4_4_ = CURLE_OK;
  }
  else {
    if (trail == 0) {
      curlx_dyn_reset(s);
    }
    else {
      memmove(s->bufr,s->bufr + (s->leng - trail),trail);
      s->leng = trail;
      s->bufr[s->leng] = '\0';
    }
    s_local._4_4_ = CURLE_OK;
  }
  return s_local._4_4_;
}

Assistant:

CURLcode Curl_dyn_tail(struct dynbuf *s, size_t trail)
{
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  if(trail > s->leng)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  else if(trail == s->leng)
    return CURLE_OK;
  else if(!trail) {
    Curl_dyn_reset(s);
  }
  else {
    memmove(&s->bufr[0], &s->bufr[s->leng - trail], trail);
    s->leng = trail;
    s->bufr[s->leng] = 0;
  }
  return CURLE_OK;

}